

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__hdr_test(stbi__context *s)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  int i;
  long lVar4;
  
  lVar4 = 0;
  iVar3 = 1;
  do {
    if (lVar4 == 0xb) goto LAB_00104eb9;
    cVar1 = "#?RADIANCE\n"[lVar4];
    bVar2 = stbi__get8(s);
    lVar4 = lVar4 + 1;
  } while ((uint)bVar2 == (int)cVar1);
  iVar3 = 0;
LAB_00104eb9:
  s->img_buffer = s->img_buffer_original;
  return iVar3;
}

Assistant:

static int stbi__hdr_test(stbi__context* s)
{
   int r = stbi__hdr_test_core(s);
   stbi__rewind(s);
   return r;
}